

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O0

string * __thiscall
helics::HandleManager::generateName_abi_cxx11_(HandleManager *this,InterfaceType what)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  unsigned_long in_stack_ffffffffffffffd8;
  
  this_01 = in_RDI;
  std::__cxx11::string::string(in_stack_ffffffffffffffb0);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (ulong)(byte)(in_DL + 0x9b);
  switch(this_00) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_01,(char *)in_RDI);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_01,(char *)in_RDI);
    break;
  default:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_01,(char *)in_RDI);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_01,(char *)in_RDI);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xb:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_01,(char *)in_RDI);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xe:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_01,(char *)in_RDI);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_01,(char *)in_RDI);
  }
  std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::size
            ((deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *)0x59056b);
  CLI::std::__cxx11::to_string(in_stack_ffffffffffffffd8);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (this_00,in_RSI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  return (string *)this_01;
}

Assistant:

std::string HandleManager::generateName(InterfaceType what) const
{
    std::string base;
    switch (what) {
        case InterfaceType::ENDPOINT:
            base = "_ept_";
            break;
        case InterfaceType::INPUT:
            base = "_input_";
            break;
        case InterfaceType::PUBLICATION:
            base = "_pub_";
            break;
        case InterfaceType::FILTER:
            base = "_filter_";
            break;
        case InterfaceType::TRANSLATOR:
            base = "_translator_";
            break;
        case InterfaceType::SINK:
            base = "_sink_";
            break;
        default:
            base = "_handle_";
            break;
    }
    base.append(std::to_string(handles.size()));
    return base;
}